

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl_bio.c
# Opt level: O0

int amqp_openssl_bio_should_retry(int res)

{
  int iVar1;
  int in_EDI;
  int err;
  int local_4;
  
  if ((in_EDI == -1) &&
     ((((iVar1 = amqp_os_socket_error(), iVar1 == 0xb || (iVar1 == 0x6b)) || (iVar1 == 4)) ||
      (((iVar1 == 0xb || (iVar1 == 0x47)) || ((iVar1 == 0x73 || (iVar1 == 0x72)))))))) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int amqp_openssl_bio_should_retry(int res) {
  if (res == -1) {
    int err = amqp_os_socket_error();
    if (
#ifdef EWOULDBLOCK
        err == EWOULDBLOCK ||
#endif
#ifdef WSAEWOULDBLOCK
        err == WSAEWOULDBLOCK ||
#endif
#ifdef ENOTCONN
        err == ENOTCONN ||
#endif
#ifdef EINTR
        err == EINTR ||
#endif
#ifdef EAGAIN
        err == EAGAIN ||
#endif
#ifdef EPROTO
        err == EPROTO ||
#endif
#ifdef EINPROGRESS
        err == EINPROGRESS ||
#endif
#ifdef EALREADY
        err == EALREADY ||
#endif
        0) {
      return 1;
    }
  }
  return 0;
}